

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

CompilationUnitSymbol * __thiscall slang::ast::Compilation::createScriptScope(Compilation *this)

{
  CompilationUnitSymbol *this_00;
  Compilation *in_RDI;
  BumpAllocator *unaff_retaddr;
  CompilationUnitSymbol *unit;
  SourceLibrary *in_stack_fffffffffffffff0;
  Compilation *args;
  
  args = in_RDI;
  getDefaultLibrary(in_RDI);
  this_00 = BumpAllocator::
            emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
                      (unaff_retaddr,args,in_stack_fffffffffffffff0);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::operator->
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             0x118c291);
  Scope::addMember((Scope *)this_00,(Symbol *)in_RDI);
  return this_00;
}

Assistant:

CompilationUnitSymbol& Compilation::createScriptScope() {
    SLANG_ASSERT(!isFrozen());

    auto unit = emplace<CompilationUnitSymbol>(*this, getDefaultLibrary());
    root->addMember(*unit);
    return *unit;
}